

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

cio_error cio_http_server_serve(cio_http_server *server)

{
  cio_server_socket *arg0;
  cio_error cVar1;
  
  arg0 = &server->server_socket;
  cVar1 = cio_server_socket_set_reuse_address(arg0,true);
  if (((cVar1 == CIO_SUCCESS) &&
      (cVar1 = cio_server_socket_bind(arg0,&server->endpoint), cVar1 == CIO_SUCCESS)) &&
     (cVar1 = cio_server_socket_accept(arg0,handle_accept,server), cVar1 == CIO_SUCCESS)) {
    return CIO_SUCCESS;
  }
  cio_server_socket_close(arg0);
  return cVar1;
}

Assistant:

enum cio_error cio_http_server_serve(struct cio_http_server *server)
{
	enum cio_error err = cio_server_socket_set_reuse_address(&server->server_socket, true);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto close_socket;
	}

	err = cio_server_socket_bind(&server->server_socket, &server->endpoint);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto close_socket;
	}

	err = cio_server_socket_accept(&server->server_socket, handle_accept, server);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto close_socket;
	}

	return err;

close_socket:
	cio_server_socket_close(&server->server_socket);
	return err;
}